

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan
               (Fixer *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicNotify *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  StringNew *pSVar28;
  ArrayNewFixed *pAVar29;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_03;
  Name *currp_04;
  Expression **currp_05;
  Expression **currp_06;
  ulong uVar30;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar30 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case IfId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pMVar25->size,currp_02);
    goto LAB_00163e40;
  case LoopId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00163a19;
  case BreakId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pBVar16->condition,currp_01);
    ppEVar4 = &pBVar16->value;
    currp_03 = extraout_RDX;
    goto LAB_00163913;
  case SwitchId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    currp_03 = extraout_RDX_00;
    goto LAB_00163913;
  case CallId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar30 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitCallIndirect,
               currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pCVar13->target);
    uVar30 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLocalSet,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00163c71;
  case GlobalGetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitGlobalSet,currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00163a19;
  case LoadId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00163e58;
  case StoreId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00163c38;
  case ConstId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00163c71;
  case BinaryId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBinary,currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::Binary>(this);
    goto LAB_00163bda;
  case SelectId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00163e31;
  case DropId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00163aaa;
  case ReturnId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    currp_03 = extraout_RDX_02;
    goto LAB_00163913;
  case MemorySizeId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemorySize,currp)
    ;
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryGrow,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00163aaa;
  case NopId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitUnreachable,currp
              );
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicRMW,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00163cb8;
  case AtomicCmpxchgId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicCmpxchg,
               currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00163ca9;
  case AtomicWaitId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicWait,currp)
    ;
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00163a39;
  case AtomicNotifyId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar5 = Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00163bda;
  case AtomicFenceId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitAtomicFence,currp
              );
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDExtract,currp
              );
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00163c71;
  case SIMDReplaceId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDReplace,currp
              );
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::SIMDReplace>(this);
    currp_04 = &pAVar5->memory;
    goto LAB_00163be8;
  case SIMDShuffleId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDShuffle,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00163e40;
  case SIMDTernaryId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDTernary,currp
              );
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00163a39;
  case SIMDShiftId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDShift,currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00163bda;
  case SIMDLoadId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00163b74;
  case SIMDLoadStoreLaneId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSIMDLoadStoreLane
               ,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00163c38:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00163e58;
  case MemoryInitId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryInit,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00163ca9;
  case DataDropId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryCopy,currp)
    ;
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00163e31;
  case MemoryFillId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitMemoryFill,currp)
    ;
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00163e31;
  case PopId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefIsNull,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00163aaa;
  case RefFuncId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00163e40;
  case TableGetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableGet,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00163a19:
    ppEVar4 = &pGVar8->value;
    goto LAB_00163e58;
  case TableSetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableSet,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00163cb8;
  case TableSizeId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableGrow,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00163cb8;
  case TableFillId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableFill,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00163ca9;
  case TableCopyId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00163e31;
  case TableInitId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTableInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00163ca9;
  case TryId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar30 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00163e58;
  case TryTableId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTryTable,currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00163aaa;
  case ThrowId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar30 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case RethrowId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitThrowRef,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00163aaa;
  case TupleMakeId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTupleMake,currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar30 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitTupleExtract,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00163aaa;
  case RefI31Id:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00163aaa;
  case I31GetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00163aaa;
  case CallRefId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pCVar9->target);
    uVar30 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case RefTestId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefTest,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00163aaa;
  case RefCastId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefCast,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00163aaa;
  case BrOnId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00163b74:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00163e58;
  case StructNewId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructNew,currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar30 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case StructGetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructGet,currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00163c71;
  case StructSetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructSet,currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00163bda;
  case StructRMWId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructRMW,currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00163bda;
  case StructCmpxchgId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStructCmpxchg,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00163a39:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)&pAVar5->memory);
    currp_04 = (Name *)&pAVar5->notifyCount;
    goto LAB_00163be8;
  case ArrayNewId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNew,currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pAVar18->size);
    ppEVar4 = &pAVar18->init;
    currp_03 = extraout_RDX_01;
LAB_00163913:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,(TaskFunc)ppEVar4
               ,currp_03);
    return;
  case ArrayNewDataId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNewData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00163cb8;
  case ArrayNewElemId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNewElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00163cb8;
  case ArrayNewFixedId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayNewFixed,
               currp);
    pAVar29 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar30 = (ulong)(uint)(pAVar29->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar29->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayGet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00163e40;
  case ArraySetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArraySet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00163e31;
  case ArrayLenId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayLen,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00163aaa;
  case ArrayCopyId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00163e22;
  case ArrayFillId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00163e22:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00163e31;
  case ArrayInitDataId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayInitData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_001635a9;
  case ArrayInitElemId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitArrayInitElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_001635a9:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)&pAVar12->memory);
LAB_00163ca9:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pAVar12->replacement);
LAB_00163cb8:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00163e58;
  case RefAsId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00163c71;
  case StringNewId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringNew,currp);
    pSVar28 = Expression::cast<wasm::StringNew>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pSVar28->end,currp_05);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pSVar28->start,currp_06);
    ppEVar4 = &pSVar28->ref;
    goto LAB_00163e58;
  case StringConstId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringConst,currp
              );
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringMeasure,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00163c71:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00163e58;
  case StringEncodeId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringEncode,
               currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StringEncode>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::maybePushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               (TaskFunc)&pAVar5->memory,currp_00);
    currp_04 = (Name *)&pAVar5->notifyCount;
    goto LAB_00163be8;
  case StringConcatId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringConcat,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00163e40;
  case StringEqId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringEq,currp);
    pAVar5 = (AtomicNotify *)Expression::cast<wasm::StringEq>(this);
LAB_00163bda:
    currp_04 = (Name *)&pAVar5->notifyCount;
LAB_00163be8:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)currp_04);
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00163e58;
  case StringWTF16GetId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringWTF16Get,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00163e40;
  case StringSliceWTFId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStringSliceWTF,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00163e31:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pMVar25->size);
LAB_00163e40:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               &pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00163e58;
  case ContNewId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitContNew,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00163aaa:
    ppEVar4 = &pTVar7->body;
LAB_00163e58:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               ppEVar4);
    return;
  case ContBindId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)(pCVar6 + 0x30));
    uVar30 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case SuspendId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitSuspend,currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar30 = (ulong)*(uint *)(pSVar22 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar22 + 0x20),uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case ResumeId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)(pRVar2 + 0x70));
    uVar30 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitResumeThrow,currp
              );
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)(pRVar26 + 0x80));
    uVar30 = (ulong)*(uint *)(pRVar26 + 0x68);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar26 + 0x60),uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::doVisitStackSwitch,currp
              );
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
               (Expression **)(pSVar3 + 0x40));
    uVar30 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar30);
      Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
                ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
                 ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
                 ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }